

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::setModified(QTextDocumentPrivate *this,bool m)

{
  byte in_SIL;
  QTextDocumentPrivate *in_RDI;
  QTextDocument *q;
  undefined1 in_stack_ffffffffffffffdf;
  
  q_func(in_RDI);
  if ((in_SIL & 1) != (in_RDI->modified & 1U)) {
    in_RDI->modified = (bool)(in_SIL & 1);
    if ((in_RDI->modified & 1U) == 0) {
      in_RDI->modifiedState = in_RDI->undoState;
    }
    else {
      in_RDI->modifiedState = -1;
    }
    QTextDocument::modificationChanged((QTextDocument *)0x7d73b1,(bool)in_stack_ffffffffffffffdf);
  }
  return;
}

Assistant:

void QTextDocumentPrivate::setModified(bool m)
{
    Q_Q(QTextDocument);
    if (m == modified)
        return;

    modified = m;
    if (!modified)
        modifiedState = undoState;
    else
        modifiedState = -1;

    emit q->modificationChanged(modified);
}